

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O1

int __thiscall
DeviceTy::associatePtr(DeviceTy *this,void *HstPtrBegin,void *TgtPtrBegin,int64_t Size)

{
  HostDataToTargetListTy *pHVar1;
  size_t *psVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  int iVar5;
  _List_node_base *p_Var6;
  int unaff_EBP;
  mutex *__mutex;
  
  __mutex = &this->DataMapMtx;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  pHVar1 = &this->HostDataToTargetMap;
  p_Var6 = (_List_node_base *)pHVar1;
  do {
    p_Var6 = (((_List_base<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_> *)
              &p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var6 == (_List_node_base *)pHVar1) goto LAB_00102e55;
  } while (p_Var6[1]._M_prev != (_List_node_base *)HstPtrBegin);
  p_Var3 = p_Var6[2]._M_next;
  p_Var4 = p_Var6[2]._M_prev;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  unaff_EBP = -(uint)(p_Var4 != (_List_node_base *)TgtPtrBegin ||
                     p_Var3 != (_List_node_base *)(Size + (long)HstPtrBegin));
LAB_00102e55:
  if (p_Var6 == (_List_node_base *)pHVar1) {
    p_Var6 = (_List_node_base *)operator_new(0x38);
    p_Var6[1]._M_next = (_List_node_base *)HstPtrBegin;
    p_Var6[1]._M_prev = (_List_node_base *)HstPtrBegin;
    p_Var6[2]._M_next = (_List_node_base *)(Size + (long)HstPtrBegin);
    p_Var6[2]._M_prev = (_List_node_base *)TgtPtrBegin;
    p_Var6[3]._M_next = (_List_node_base *)0x3fffffffffffffff;
    std::__detail::_List_node_base::_M_hook(p_Var6);
    psVar2 = &(this->HostDataToTargetMap).
              super__List_base<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>._M_impl.
              _M_node._M_size;
    *psVar2 = *psVar2 + 1;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    unaff_EBP = 0;
  }
  return unaff_EBP;
}

Assistant:

int DeviceTy::associatePtr(void *HstPtrBegin, void *TgtPtrBegin, int64_t Size) {
  DataMapMtx.lock();

  // Check if entry exists
  for (auto &HT : HostDataToTargetMap) {
    if ((uintptr_t)HstPtrBegin == HT.HstPtrBegin) {
      // Mapping already exists
      bool isValid = HT.HstPtrBegin == (uintptr_t) HstPtrBegin &&
                     HT.HstPtrEnd == (uintptr_t) HstPtrBegin + Size &&
                     HT.TgtPtrBegin == (uintptr_t) TgtPtrBegin;
      DataMapMtx.unlock();
      if (isValid) {
        DP("Attempt to re-associate the same device ptr+offset with the same "
            "host ptr, nothing to do\n");
        return OFFLOAD_SUCCESS;
      } else {
        DP("Not allowed to re-associate a different device ptr+offset with the "
            "same host ptr\n");
        return OFFLOAD_FAIL;
      }
    }
  }

  // Mapping does not exist, allocate it
  HostDataToTargetTy newEntry;

  // Set up missing fields
  newEntry.HstPtrBase = (uintptr_t) HstPtrBegin;
  newEntry.HstPtrBegin = (uintptr_t) HstPtrBegin;
  newEntry.HstPtrEnd = (uintptr_t) HstPtrBegin + Size;
  newEntry.TgtPtrBegin = (uintptr_t) TgtPtrBegin;
  // refCount must be infinite
  newEntry.RefCount = INF_REF_CNT;

  DP("Creating new map entry: HstBase=" DPxMOD ", HstBegin=" DPxMOD ", HstEnd="
      DPxMOD ", TgtBegin=" DPxMOD "\n", DPxPTR(newEntry.HstPtrBase),
      DPxPTR(newEntry.HstPtrBegin), DPxPTR(newEntry.HstPtrEnd),
      DPxPTR(newEntry.TgtPtrBegin));
  HostDataToTargetMap.push_front(newEntry);

  DataMapMtx.unlock();

  return OFFLOAD_SUCCESS;
}